

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O3

void __thiscall
cfd::ConfidentialTransactionContext::SignWithPrivkeySimple
          (ConfidentialTransactionContext *this,OutPoint *outpoint,Pubkey *pubkey,Privkey *privkey,
          SigHashType *sighash_type,Amount *value,AddressType address_type,bool has_grind_r)

{
  SigHashType local_64;
  ConfidentialValue local_58;
  
  core::SigHashType::SigHashType(&local_64,sighash_type);
  core::ConfidentialValue::ConfidentialValue(&local_58,value);
  SignWithPrivkeySimple(this,outpoint,pubkey,privkey,&local_64,&local_58,address_type,has_grind_r);
  local_58._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_00723840;
  if (local_58.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ConfidentialTransactionContext::SignWithPrivkeySimple(
    const OutPoint& outpoint, const Pubkey& pubkey, const Privkey& privkey,
    SigHashType sighash_type, const Amount& value, AddressType address_type,
    bool has_grind_r) {
  SignWithPrivkeySimple(
      outpoint, pubkey, privkey, sighash_type, ConfidentialValue(value),
      address_type, has_grind_r);
}